

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

int __thiscall cmCPackIFWGenerator::InitializeInternal(cmCPackIFWGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  allocator local_542;
  allocator local_541;
  string local_540;
  undefined1 local_520 [8];
  string sysName;
  string local_4f8;
  char *local_4d8;
  char *optExeSuffix;
  undefined1 local_4b0 [8];
  ostringstream cmCPackLog_msg_1;
  allocator local_331;
  string local_330;
  char *local_310;
  char *cpackDownloadAll;
  string local_300;
  char *local_2e0;
  char *ifwDownloadAll;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  char *local_288;
  char *dirs;
  string local_278;
  allocator local_251;
  string local_250;
  char *local_230;
  char *FrameworkVersionSrt;
  char *RepoGenStr;
  string local_218 [32];
  undefined1 local_1f8 [8];
  ostringstream cmCPackLog_msg;
  char *BinCreatorStr;
  undefined1 local_70 [8];
  string RepoGenOpt;
  allocator local_39;
  undefined1 local_38 [8];
  string BinCreatorOpt;
  cmCPackIFWGenerator *this_local;
  
  BinCreatorOpt.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"CPACK_IFW_BINARYCREATOR_EXECUTABLE",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_70,"CPACK_IFW_REPOGEN_EXECUTABLE",
             (allocator *)((long)&BinCreatorStr + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&BinCreatorStr + 7));
  bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_38);
  if ((!bVar2) ||
     (bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_70), !bVar2)) {
    cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackIFW.cmake");
  }
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_38);
  if ((pcVar3 == (char *)0x0) || (bVar2 = cmSystemTools::IsNOTFOUND(pcVar3), bVar2)) {
    std::__cxx11::string::operator=((string *)&this->BinCreator,"");
  }
  else {
    std::__cxx11::string::operator=((string *)&this->BinCreator,pcVar3);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    FrameworkVersionSrt =
         cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_70);
    if ((FrameworkVersionSrt == (char *)0x0) ||
       (bVar2 = cmSystemTools::IsNOTFOUND(FrameworkVersionSrt), bVar2)) {
      std::__cxx11::string::operator=((string *)&this->RepoGen,"");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->RepoGen,FrameworkVersionSrt);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_250,"CPACK_IFW_FRAMEWORK_VERSION",&local_251);
    pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    local_230 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->FrameworkVersion,"1.9.9");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->FrameworkVersion,pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_278,"CPACK_IFW_RESOLVE_DUPLICATE_NAMES",
               (allocator *)((long)&dirs + 7));
    bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_278);
    this->ResolveDuplicateNames = bVar2;
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dirs + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->PkgsDirsVector);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"CPACK_IFW_PACKAGES_DIRECTORIES",&local_2a9);
    pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    local_288 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2d0,pcVar3,(allocator *)((long)&ifwDownloadAll + 7));
      cmSystemTools::ExpandListArgument(&local_2d0,&this->PkgsDirsVector,false);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ifwDownloadAll + 7));
    }
    (this->Installer).Generator = this;
    cmCPackIFWInstaller::ConfigureFromOptions(&this->Installer);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_300,"CPACK_IFW_DOWNLOAD_ALL",
               (allocator *)((long)&cpackDownloadAll + 7));
    pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cpackDownloadAll + 7));
    local_2e0 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_330,"CPACK_DOWNLOAD_ALL",&local_331);
      pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      local_310 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        this->OnlineOnly = false;
      }
      else {
        bVar2 = cmSystemTools::IsOn(pcVar3);
        this->OnlineOnly = bVar2;
      }
    }
    else {
      bVar2 = cmSystemTools::IsOn(pcVar3);
      this->OnlineOnly = bVar2;
    }
    bVar2 = std::
            vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
            ::empty(&(this->Installer).Repositories);
    if ((bVar2) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_4f8,"CMAKE_EXECUTABLE_SUFFIX",
                 (allocator *)(sysName.field_2._M_local_buf + 0xf));
      pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_4f8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator((allocator<char> *)(sysName.field_2._M_local_buf + 0xf));
      local_4d8 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = cmCPackGenerator::GetOutputExtension(&this->super_cmCPackGenerator);
        std::__cxx11::string::operator=((string *)&this->ExecutableSuffix,pcVar3);
      }
      else {
        std::__cxx11::string::operator=((string *)&this->ExecutableSuffix,pcVar3);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_540,"CMAKE_SYSTEM_NAME",&local_541);
          pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_540);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_520,pcVar3,&local_542);
          std::allocator<char>::~allocator((allocator<char> *)&local_542);
          std::__cxx11::string::~string((string *)&local_540);
          std::allocator<char>::~allocator((allocator<char> *)&local_541);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_520,"Linux");
          if (bVar2) {
            std::__cxx11::string::operator=((string *)&this->ExecutableSuffix,".run");
          }
          std::__cxx11::string::~string((string *)local_520);
        }
      }
      this_local._4_4_ = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
      poVar5 = std::operator<<((ostream *)local_4b0,
                               "Cannot find QtIFW repository generator \"repogen\": likely it is not installed, or not in your PATH"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x158,pcVar3);
      std::__cxx11::string::~string((string *)&optExeSuffix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
      this_local._4_4_ = 0;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar5 = std::operator<<((ostream *)local_1f8,
                             "Cannot find QtIFW compiler \"binarycreator\": likely it is not installed, or not in your PATH"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x119,pcVar3);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
    this_local._4_4_ = 0;
  }
  RepoGenStr._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWGenerator::InitializeInternal()
{
  // Search Qt Installer Framework tools

  const std::string BinCreatorOpt = "CPACK_IFW_BINARYCREATOR_EXECUTABLE";
  const std::string RepoGenOpt = "CPACK_IFW_REPOGEN_EXECUTABLE";

  if(!this->IsSet(BinCreatorOpt) ||
     !this->IsSet(RepoGenOpt))
    {
    this->ReadListFile("CPackIFW.cmake");
    }

  // Look 'binarycreator' executable (needs)

  const char *BinCreatorStr = this->GetOption(BinCreatorOpt);
  if(!BinCreatorStr || cmSystemTools::IsNOTFOUND(BinCreatorStr))
    {
    BinCreator = "";
    }
  else
    {
    BinCreator = BinCreatorStr;
    }

  if (BinCreator.empty())
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find QtIFW compiler \"binarycreator\": "
                  "likely it is not installed, or not in your PATH"
                  << std::endl);
    return 0;
    }

  // Look 'repogen' executable (optional)

  const char *RepoGenStr = this->GetOption(RepoGenOpt);
  if(!RepoGenStr || cmSystemTools::IsNOTFOUND(RepoGenStr))
    {
    RepoGen = "";
    }
  else
    {
    RepoGen = RepoGenStr;
    }

  // Framework version
  if(const char* FrameworkVersionSrt =
      this->GetOption("CPACK_IFW_FRAMEWORK_VERSION"))
    {
    FrameworkVersion = FrameworkVersionSrt;
    }
  else
    {
    FrameworkVersion = "1.9.9";
    }

  // Variables that Change Behavior

  // Resolve duplicate names
  ResolveDuplicateNames = this->IsOn("CPACK_IFW_RESOLVE_DUPLICATE_NAMES");

  // Additional packages dirs
  PkgsDirsVector.clear();
  if(const char* dirs = this->GetOption("CPACK_IFW_PACKAGES_DIRECTORIES"))
    {
    cmSystemTools::ExpandListArgument(dirs,
                                      PkgsDirsVector);
    }

  // Installer
  Installer.Generator = this;
  Installer.ConfigureFromOptions();

  if (const char* ifwDownloadAll =
      this->GetOption("CPACK_IFW_DOWNLOAD_ALL"))
    {
    OnlineOnly = cmSystemTools::IsOn(ifwDownloadAll);
    }
  else if (const char* cpackDownloadAll =
           this->GetOption("CPACK_DOWNLOAD_ALL"))
    {
    OnlineOnly = cmSystemTools::IsOn(cpackDownloadAll);
    }
  else
    {
    OnlineOnly = false;
    }

  if (!Installer.Repositories.empty() && RepoGen.empty()) {
  cmCPackLogger(cmCPackLog::LOG_ERROR,
                "Cannot find QtIFW repository generator \"repogen\": "
                "likely it is not installed, or not in your PATH"
                << std::endl);
  return 0;
  }

  // Executable suffix
  if(const char *optExeSuffix = this->GetOption("CMAKE_EXECUTABLE_SUFFIX"))
    {
    ExecutableSuffix = optExeSuffix;
    if(ExecutableSuffix.empty())
      {
      std::string sysName(this->GetOption("CMAKE_SYSTEM_NAME"));
      if(sysName == "Linux")
        {
        ExecutableSuffix = ".run";
        }
      }
    }
  else
    {
    ExecutableSuffix = cmCPackGenerator::GetOutputExtension();
    }

  return this->Superclass::InitializeInternal();
}